

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

Page * pager_alloc_page(Pager *pPager,pgno num_page)

{
  Page *pNew;
  pgno num_page_local;
  Pager *pPager_local;
  
  pPager_local = (Pager *)SyMemBackendPoolAlloc(pPager->pAllocator,pPager->iPageSize + 0x68);
  if (pPager_local == (Pager *)0x0) {
    pPager_local = (Pager *)0x0;
  }
  else {
    SyZero(pPager_local,pPager->iPageSize + 0x68);
    pPager_local->pAllocator = (SyMemBackend *)((pPager_local->sPrng).s + 2);
    pPager_local->zFilename = (char *)pPager;
    *(undefined4 *)((long)&pPager_local->zJournal + 4) = 1;
    pPager_local->pEngine = (unqlite_kv_engine *)num_page;
  }
  return (Page *)pPager_local;
}

Assistant:

static Page * pager_alloc_page(Pager *pPager,pgno num_page)
{
	Page *pNew;
	
	pNew = (Page *)SyMemBackendPoolAlloc(pPager->pAllocator,sizeof(Page)+pPager->iPageSize);
	if( pNew == 0 ){
		return 0;
	}
	/* Zero the structure */
	SyZero(pNew,sizeof(Page)+pPager->iPageSize);
	/* Page data */
	pNew->zData = (unsigned char *)&pNew[1];
	/* Fill in the structure */
	pNew->pPager = pPager;
	pNew->nRef = 1;
	pNew->pgno = num_page;
	return pNew;
}